

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

int Abc_NtkDarSeqSim3(Abc_Ntk_t *pNtk,Ssw_RarPars_t *pPars)

{
  Vec_Ptr_t *__ptr;
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAig;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Aig_Man_t *pAVar5;
  long lVar6;
  
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    pAVar4 = pNtk;
    uVar2 = Abc_NtkGetChoiceNum(pNtk);
    Abc_Print((int)pAVar4,"Removing %d choices from the AIG.\n",(ulong)uVar2);
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  }
  pAig = Abc_NtkToDar(pNtk,0,1);
  iVar1 = Ssw_RarSimulate(pAig,pPars);
  iVar3 = -1;
  if (iVar1 == 0) {
    if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
      pAVar5 = pAig;
      iVar1 = Saig_ManVerifyCex(pAig,pAig->pSeqModel);
      if (iVar1 == 0) {
        Abc_Print((int)pAVar5,"Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n");
      }
    }
    if (pNtk->pModel != (int *)0x0) {
      free(pNtk->pModel);
      pNtk->pModel = (int *)0x0;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      free(pNtk->pSeqModel);
    }
    pNtk->pSeqModel = pAig->pSeqModel;
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
    iVar3 = 0;
  }
  __ptr = pNtk->vSeqModelVec;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    iVar1 = __ptr->nSize;
    if (0 < iVar1) {
      lVar6 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar6]) {
          free(__ptr->pArray[lVar6]);
          iVar1 = __ptr->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar1);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  pNtk->vSeqModelVec = pAig->vSeqModelVec;
  pAig->vSeqModelVec = (Vec_Ptr_t *)0x0;
  pNtk->pData = pAig->pData;
  pAig->pData = (void *)0x0;
  Aig_ManStop(pAig);
  return iVar3;
}

Assistant:

int Abc_NtkDarSeqSim3( Abc_Ntk_t * pNtk, Ssw_RarPars_t * pPars )
{
    Aig_Man_t * pMan;
    int status, RetValue = -1;
//    abctime clk = Abc_Clock();
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        Abc_Print( 1, "Removing %d choices from the AIG.\n", Abc_NtkGetChoiceNum(pNtk) );
        Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    }
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( Ssw_RarSimulate( pMan, pPars ) == 0 )
    { 
        if ( pMan->pSeqModel )
        {
//            Abc_Print( 1, "Simulation of %d frames with %d words asserted output %d in frame %d. ", 
//                nFrames, nWords, pMan->pSeqModel->iPo, pMan->pSeqModel->iFrame );
            status = Saig_ManVerifyCex( pMan, pMan->pSeqModel );
            if ( status == 0 )
                Abc_Print( 1, "Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n" );
        }
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
        RetValue = 0;
    }
    else
    {
//        Abc_Print( 1, "Simulation of %d frames with %d words did not assert the outputs.    ", 
//            nFrames, nWords );
    }
    if ( pNtk->vSeqModelVec )
        Vec_PtrFreeFree( pNtk->vSeqModelVec );
    pNtk->vSeqModelVec = pMan->vSeqModelVec;  pMan->vSeqModelVec = NULL;
//    ABC_PRT( "Time", Abc_Clock() - clk );
    pNtk->pData = pMan->pData; pMan->pData = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}